

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_publication.cpp
# Opt level: O1

void __thiscall
miniros::ServicePublication::ServicePublication
          (ServicePublication *this,string *name,string *md5sum,string *data_type,
          string *request_data_type,string *response_data_type,ServiceCallbackHelperPtr *helper,
          CallbackQueueInterface *callback_queue,VoidConstPtr *tracked_object)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_enable_shared_from_this<miniros::ServicePublication>)._M_weak_this.
  super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<miniros::ServicePublication>)._M_weak_this.
  super___weak_ptr<miniros::ServicePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  (this->md5sum_)._M_dataplus._M_p = (pointer)&(this->md5sum_).field_2;
  pcVar1 = (md5sum->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->md5sum_,pcVar1,pcVar1 + md5sum->_M_string_length);
  (this->data_type_)._M_dataplus._M_p = (pointer)&(this->data_type_).field_2;
  pcVar1 = (data_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->data_type_,pcVar1,pcVar1 + data_type->_M_string_length);
  (this->request_data_type_)._M_dataplus._M_p = (pointer)&(this->request_data_type_).field_2;
  pcVar1 = (request_data_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->request_data_type_,pcVar1,pcVar1 + request_data_type->_M_string_length
            );
  (this->response_data_type_)._M_dataplus._M_p = (pointer)&(this->response_data_type_).field_2;
  pcVar1 = (response_data_type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->response_data_type_,pcVar1,
             pcVar1 + response_data_type->_M_string_length);
  (this->helper_).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (helper->super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->helper_).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->client_links_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->client_links_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->client_links_mutex_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->client_links_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->client_links_mutex_).super___mutex_base._M_mutex.__align = 0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->client_links_).
  super__Vector_base<std::shared_ptr<miniros::ServiceClientLink>,_std::allocator<std::shared_ptr<miniros::ServiceClientLink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->dropped_ = false;
  this->callback_queue_ = callback_queue;
  this->has_tracked_object_ = false;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
    }
  }
  if ((tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    this->has_tracked_object_ = true;
  }
  return;
}

Assistant:

ServicePublication::ServicePublication(const std::string& name, const std::string &md5sum, const std::string& data_type, const std::string& request_data_type,
                             const std::string& response_data_type, const ServiceCallbackHelperPtr& helper, CallbackQueueInterface* callback_queue,
                             const VoidConstPtr& tracked_object)
: name_(name)
, md5sum_(md5sum)
, data_type_(data_type)
, request_data_type_(request_data_type)
, response_data_type_(response_data_type)
, helper_(helper)
, dropped_(false)
, callback_queue_(callback_queue)
, has_tracked_object_(false)
, tracked_object_(tracked_object)
{
  if (tracked_object)
  {
    has_tracked_object_ = true;
  }
}